

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmGhsMultiTargetGenerator::VisitCustomCommand
          (cmGhsMultiTargetGenerator *this,
          set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          *temp,set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *perm,vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order,
          cmSourceFile *si)

{
  bool bVar1;
  cmCustomCommand *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference name;
  cmLocalGenerator *this_02;
  cmMakefile *this_03;
  cmSourceFile *si_00;
  pair<std::_Rb_tree_const_iterator<const_cmSourceFile_*>,_bool> pVar2;
  cmSourceFile *sf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Self local_48;
  _Self local_40;
  cmSourceFile *local_38;
  cmSourceFile *si_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order_local;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *perm_local;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *temp_local;
  cmGhsMultiTargetGenerator *this_local;
  
  local_38 = si;
  si_local = (cmSourceFile *)order;
  order_local = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)perm;
  perm_local = temp;
  temp_local = (set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *)this;
  local_40._M_node =
       (_Base_ptr)
       std::
       set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
       ::find(perm,&local_38);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
       ::end((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
              *)order_local);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    pVar2 = std::
            set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
            ::insert(perm_local,&local_38);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      this_local._7_1_ = true;
    }
    else {
      this_00 = cmSourceFile::GetCustomCommand(local_38);
      this_01 = cmCustomCommand::GetDepends_abi_cxx11_(this_00);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
      di = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&di), bVar1) {
        name = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
        this_02 = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
        this_03 = cmLocalGenerator::GetMakefile(this_02);
        si_00 = cmMakefile::GetSourceFileWithOutput(this_03,name);
        if ((si_00 != (cmSourceFile *)0x0) &&
           (bVar1 = VisitCustomCommand(this,perm_local,
                                       (set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                                        *)order_local,
                                       (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                        *)si_local,si_00), bVar1)) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
      ::insert((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *)order_local,&local_38);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)si_local,
                 &local_38);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGhsMultiTargetGenerator::VisitCustomCommand(
  std::set<cmSourceFile const*>& temp, std::set<cmSourceFile const*>& perm,
  std::vector<cmSourceFile const*>& order, cmSourceFile const* si)
{
  /* check if permanent mark is set*/
  if (perm.find(si) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(si).second) {
      for (auto& di : si->GetCustomCommand()->GetDepends()) {
        cmSourceFile const* sf = this->GeneratorTarget->GetLocalGenerator()
                                   ->GetMakefile()
                                   ->GetSourceFileWithOutput(di);
        /* if sf exists then visit */
        if (sf && this->VisitCustomCommand(temp, perm, order, sf)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(si);
      order.push_back(si);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}